

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

uint __thiscall ThreadContext::ReleaseSourceDynamicProfileManagers(ThreadContext *this,WCHAR *url)

{
  BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  int *piVar2;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
  *pSVar3;
  uint uVar4;
  int iVar5;
  RecyclableData *pRVar6;
  WCHAR *pWVar7;
  WCHAR WVar8;
  uint uVar9;
  uint uVar10;
  hash_t hashCode;
  Type this_00;
  SourceDynamicProfileManagerCache *this_01;
  WCHAR *local_38;
  WCHAR *url_local;
  
  if ((this->recyclableData).ptr != (RecyclableData *)0x0) {
    local_38 = url;
    pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    pBVar1 = (pRVar6->sourceProfileManagersByUrl).ptr;
    piVar2 = (pBVar1->buckets).ptr;
    uVar4 = 0;
    if (piVar2 != (int *)0x0) {
      WVar8 = *local_38;
      if (WVar8 == L'\0') {
        hashCode = 0x2393b8b;
      }
      else {
        uVar9 = 0x811c9dc5;
        pWVar7 = local_38;
        do {
          pWVar7 = pWVar7 + 1;
          uVar10 = (ushort)WVar8 ^ uVar9;
          uVar9 = uVar10 * 0x1000193;
          WVar8 = *pWVar7;
        } while (WVar8 != L'\0');
        hashCode = uVar10 * 0x2000326 + 1;
      }
      uVar4 = JsUtil::
              BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetBucket(hashCode,pBVar1->bucketCount,pBVar1->modFunctionIndex);
      uVar9 = piVar2[uVar4];
      uVar4 = 0;
      if (-1 < (int)uVar9) {
        pSVar3 = (pBVar1->entries).ptr;
        uVar4 = 0;
        do {
          iVar5 = PAL_wcscmp(pSVar3[uVar9].
                             super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                             .
                             super_ValueEntry<Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>_>
                             .
                             super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                             .key.ptr,local_38);
          if (iVar5 == 0) {
            this_00 = pBVar1->stats;
            goto LAB_007c201b;
          }
          uVar4 = uVar4 + 1;
          uVar9 = pSVar3[uVar9].
                  super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                  .
                  super_ValueEntry<Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>_>
                  .
                  super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                  .next;
        } while (-1 < (int)uVar9);
      }
    }
    this_00 = pBVar1->stats;
    uVar9 = 0xffffffff;
LAB_007c201b:
    if (this_00 != (DictionaryStats *)0x0) {
      DictionaryStats::Lookup(this_00,uVar4);
    }
    if ((int)uVar9 < 0) {
      this_01 = (SourceDynamicProfileManagerCache *)0x0;
    }
    else {
      this_01 = (pBVar1->entries).ptr[uVar9].
                super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .
                super_KeyValueEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                .
                super_ValueEntry<Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>_>
                .
                super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                .value.ptr;
    }
    if (this_01 == (SourceDynamicProfileManagerCache *)0x0) {
      return 0;
    }
    uVar4 = SourceDynamicProfileManagerCache::Release(this_01);
    if (DAT_015d346a == '\x01') {
      Output::Trace(DynamicProfilePhase,L"Release dynamic source profile manger %d Url: %s\n",
                    (ulong)uVar4,local_38);
    }
    Output::Flush();
    if (uVar4 != 0) {
      return uVar4;
    }
    pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    JsUtil::
    BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Remove((pRVar6->sourceProfileManagersByUrl).ptr,&local_38);
  }
  return 0;
}

Assistant:

uint ThreadContext::ReleaseSourceDynamicProfileManagers(const WCHAR* url)
{
    // If we've already freed the recyclable data, we're shutting down the thread context so skip clean up
    if (this->recyclableData == nullptr) return 0;

    SourceDynamicProfileManagerCache* managerCache = this->recyclableData->sourceProfileManagersByUrl->Lookup(url, nullptr);
    uint refCount = 0;
    if(managerCache)  // manager cache may be null we exceeded -INMEMORY_CACHE_MAX_URL
    {
        refCount = managerCache->Release();
        OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Release dynamic source profile manger %d Url: %s\n"), refCount, url);
        Output::Flush();
        if(refCount == 0)
        {
            this->recyclableData->sourceProfileManagersByUrl->Remove(url);
        }
    }
    return refCount;
}